

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_primitive_createTemporaryReferenceType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_object_tuple_t *local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  sVar2 = *arguments;
  local_68 = 0;
  sStack_60 = 0;
  local_58 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = (sysbvm_object_tuple_t *)0x0;
  sStack_80 = 0;
  local_98 = arguments[1];
  sStack_90 = arguments[2];
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 9;
  local_30 = (undefined1 *)&local_98;
  sysbvm_stackFrame_pushRecord(&local_48);
  if (sStack_90 == 0) {
    sysbvm_error("Expected a valid address space for pointer type.");
  }
  local_88 = sysbvm_context_allocatePointerTuple
                       (context,(context->roots).temporaryReferenceType,0x21);
  sysbvm_association_setValue(sVar2,(sysbvm_tuple_t)local_88);
  local_88[4].field_1.pointers[0] = 0x890b;
  local_88[3].field_1.pointers[0] = 0xb;
  sVar2 = sysbvm_array_create(context,0);
  local_88[2].header.identityHashAndFlags = (int)sVar2;
  local_88[2].header.objectSize = (int)(sVar2 >> 0x20);
  local_88[2].header.field_0 =
       (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)
       (context->roots).anyTemporaryReferenceType;
  sVar2 = sysbvm_tuple_size_encode(context,(ulong)context->targetWordSize);
  local_88[4].header.identityHashAndFlags = (int)sVar2;
  local_88[4].header.objectSize = (int)(sVar2 >> 0x20);
  uVar1 = context->targetWordSize;
  sVar3 = sysbvm_addressSpace_getComponentCount(context,sStack_90);
  sVar2 = sysbvm_tuple_size_encode(context,uVar1 * sVar3);
  local_88[4].header.field_0.typePointer = sVar2;
  local_88[10].header.identityHashAndFlags = (undefined4)local_98;
  local_88[10].header.objectSize = local_98._4_4_;
  local_88[10].field_1.pointers[0] = sStack_90;
  sStack_60 = sysbvm_pointerLikeType_createPointerLikeStoreFunction
                        (context,(sysbvm_tuple_t)local_88,local_98,0x1000);
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).assignmentSelector,sStack_60);
  sVar2._0_4_ = local_88[0xb].header.identityHashAndFlags;
  sVar2._4_4_ = local_88[0xb].header.objectSize;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).refStoreSelector,sVar2);
  local_88[0xb].header.identityHashAndFlags = (undefined4)sStack_60;
  local_88[0xb].header.objectSize = sStack_60._4_4_;
  sVar2 = sysbvm_pointerLikeType_createPointerLikeLoadFunction
                    (context,(sysbvm_tuple_t)local_88,local_98,0x1000);
  local_88[0xb].header.field_0.typePointer = sVar2;
  local_58 = sVar2;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).refLoadSelector,sVar2);
  sStack_80 = sysbvm_type_createPointerType(context,local_98,sStack_90);
  sVar2 = sysbvm_pointerLikeType_createPointerLikeReinterpretCast
                    (context,(sysbvm_tuple_t)local_88,sStack_80,sVar2);
  sStack_70 = sVar2;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).addressSelector,sVar2);
  local_78 = sysbvm_type_createReferenceType(context,local_98,sStack_90);
  local_68 = sysbvm_pointerLikeType_createPointerLikeReinterpretCast
                       (context,(sysbvm_tuple_t)local_88,local_78,sVar2);
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).tempRefAsRefSelector,local_68);
  return (sysbvm_tuple_t)local_88;
}

Assistant:

static sysbvm_tuple_t sysbvm_type_primitive_createTemporaryReferenceType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    return sysbvm_type_doCreateTemporaryReferenceType(context, arguments[0], arguments[1], arguments[2]);
}